

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dos_blocker.cpp
# Opt level: O3

void __thiscall libtorrent::dht::dos_blocker::dos_blocker(dos_blocker *this)

{
  undefined8 *puVar1;
  long lVar2;
  
  this->m_message_rate_limit = 5;
  this->m_block_timeout = 300;
  lVar2 = 8;
  do {
    puVar1 = (undefined8 *)
             ((long)&this->m_ban_nodes[0].src.ipv6_address_.addr_.__in6_u + lVar2 + 0xc);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)&this->m_ban_nodes[0].src.ipv6_address_.addr_.__in6_u + lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->m_ban_nodes + lVar2 + -8);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar2 = lVar2 + 0x30;
  } while (lVar2 != 0x3c8);
  lVar2 = 0x30;
  do {
    *(undefined4 *)((long)this->m_ban_nodes + lVar2 + -8) = 0;
    *(undefined8 *)((long)this->m_ban_nodes + lVar2 + -0x10) = 0x8000000000000000;
    lVar2 = lVar2 + 0x30;
  } while (lVar2 != 0x3f0);
  return;
}

Assistant:

dos_blocker::dos_blocker()
		: m_message_rate_limit(5)
		, m_block_timeout(5 * 60)
	{
		for (auto& e : m_ban_nodes)
		{
			e.count = 0;
			e.limit = min_time();
		}
	}